

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

void __thiscall ON_Material::SetReflectivity(ON_Material *this,double reflectivity)

{
  if (reflectivity < 0.0) {
    this->m_reflectivity = 0.0;
    return;
  }
  if (1.0 < reflectivity) {
    this->m_reflectivity = 1.0;
    return;
  }
  this->m_reflectivity = reflectivity;
  return;
}

Assistant:

void ON_Material::SetReflectivity( double reflectivity )
{
  if ( reflectivity < 0.0 )
    m_reflectivity = 0.0;
  else if ( reflectivity > 1.0)
    m_reflectivity = 1.0;
  else
    m_reflectivity = reflectivity;
}